

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O1

IterateResult __thiscall glcts::CullDistance::NegativeTest::iterate(NegativeTest *this)

{
  ostringstream *this_00;
  bool use_dynamic_index_based_writes;
  int iVar1;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  GLuint GVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  size_t sVar7;
  ulong uVar8;
  GLchar *pGVar9;
  TestError *pTVar10;
  NotSupportedError *this_01;
  char *pcVar11;
  NegativeTest *pNVar12;
  GLint link_status;
  GLint buffer_size_1;
  GLint compile_status_internal;
  GLint compile_status;
  GLint gl_max_cull_distances_value;
  GLint gl_max_combined_clip_and_cull_distances_value;
  GLint gl_max_clip_distances_value;
  string vs_body_string;
  string n_gl_culldistance_array_items_string;
  string n_gl_clipdistance_array_items_string;
  string static_write_shader_body_part;
  char *vs_body_raw_ptr;
  GLchar *fs_body;
  stringstream temp_sstream;
  int local_424;
  NegativeTest *local_420;
  long local_418;
  string local_410;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  int local_3e0;
  int local_3dc;
  long local_3d8;
  int local_3cc;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8;
  undefined7 uStack_3b7;
  char *local_3a8;
  undefined8 local_3a0;
  char local_398;
  undefined7 uStack_397;
  char *local_388;
  undefined8 local_380;
  char local_378;
  undefined7 uStack_377;
  undefined1 *local_368;
  undefined8 local_360;
  undefined1 local_358;
  undefined7 uStack_357;
  undefined1 *local_348;
  char *local_340;
  undefined1 local_338 [8];
  undefined1 local_330 [8];
  TestLog local_328 [13];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [8];
  ios_base local_138 [264];
  long lVar6;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  local_340 = "#version 130\n\nvoid main()\n{\n}\n";
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_cull_distance");
  if (!bVar2) {
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
    if (!bVar2) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b8._0_8_ = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"GL_ARB_cull_distance is not supported","");
      tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b8);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_3cc = 0;
  local_3dc = 0;
  local_3e0 = 0;
  local_388 = &local_378;
  local_380 = 0;
  local_378 = '\0';
  local_3a8 = &local_398;
  local_3a0 = 0;
  local_398 = '\0';
  local_368 = &local_358;
  local_360 = 0;
  local_358 = 0;
  (**(code **)(lVar6 + 0x868))(0xd32);
  (**(code **)(lVar6 + 0x868))(0x82fa,&local_3dc);
  (**(code **)(lVar6 + 0x868))(0x82f9,&local_3e0);
  local_420 = this;
  local_3d8 = lVar6;
  if (local_3e0 + local_3cc < local_3dc) {
    local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES is larger than or equal to the sum of GL_MAX_CLIP_DISTANCES and GL_MAX_CULL_DISTANCES. Skipping."
               ,0x88);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_140);
    tcu::TestContext::setTestResult
              ((local_420->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_388,(string *)local_338);
    if (local_338 != (undefined1  [8])local_328) {
      operator_delete((void *)local_338,(ulong)((long)&(local_328[0].m_log)->flags + 1));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    lVar6 = local_3d8;
    std::__cxx11::string::operator=((string *)&local_3a8,(string *)local_338);
    if (local_338 != (undefined1  [8])local_328) {
      operator_delete((void *)local_338,(ulong)((long)&(local_328[0].m_log)->flags + 1));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"gl_ClipDistance[",0x10)
    ;
    pcVar11 = local_388;
    iVar3 = (int)local_1a8;
    if (local_388 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18));
    }
    else {
      sVar7 = strlen(local_388);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"] = 0.0f;\n",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"gl_CullDistance[",0x10)
    ;
    pcVar11 = local_3a8;
    if (local_3a8 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18));
    }
    else {
      sVar7 = strlen(local_3a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"] = 0.0f;\n",10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_368,(string *)local_338);
    pNVar12 = local_420;
    if (local_338 != (undefined1  [8])local_328) {
      operator_delete((void *)local_338,(ulong)((long)&(local_328[0].m_log)->flags + 1));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    local_3e4 = 0;
    GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
    pNVar12->m_fs_id = GVar4;
    GVar4 = (**(code **)(lVar6 + 0x3c8))();
    pNVar12->m_po_id = GVar4;
    GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
    pNVar12->m_vs_id = GVar4;
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glCreateProgram() / glCreateShader() calls failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc0c);
    (**(code **)(lVar6 + 0x10))(pNVar12->m_po_id,pNVar12->m_fs_id);
    (**(code **)(lVar6 + 0x10))(pNVar12->m_po_id,pNVar12->m_vs_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glAttachShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc11);
    (**(code **)(lVar6 + 0x12b8))(pNVar12->m_fs_id,1,&local_340,0);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc15);
    (**(code **)(lVar6 + 0x248))(pNVar12->m_fs_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc18);
    (**(code **)(lVar6 + 0xa70))(pNVar12->m_fs_id,0x8b81,&local_3e4);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc1b);
    if (local_3e4 == 0) {
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,"Fragment shader failed to compile.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                 ,0xc1f);
      __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_418 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      local_3c8 = &local_3b8;
      local_3c0 = 0;
      local_3b8 = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "#version 130\n\n    #extension GL_ARB_cull_distance : require\n\n",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      bVar2 = (bool)(&DAT_01a33bcc)[local_418 * 2];
      if (bVar2 == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#define ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"REDECLARE_OUTPUT_VARIABLES",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      }
      use_dynamic_index_based_writes = (bool)(&DAT_01a33bcd)[local_418 * 2];
      if (use_dynamic_index_based_writes == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#define ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"DYNAMIC_INDEX_BASED_WRITES",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "#ifdef REDECLARE_OUTPUT_VARIABLES\n    out float gl_ClipDistance[N_GL_CLIPDISTANCE_ENTRIES];\n    out float gl_CullDistance[N_GL_CULLDISTANCE_ENTRIES];\n#endif\n\nvoid main()\n{\n#ifdef DYNAMIC_INDEX_BASED_WRITES\n    for (int n_clipdistance_entry = 0;\n             n_clipdistance_entry < N_GL_CLIPDISTANCE_ENTRIES;\n           ++n_clipdistance_entry)\n    {\n        gl_ClipDistance[n_clipdistance_entry] = float(n_clipdistance_entry) / float(N_GL_CLIPDISTANCE_ENTRIES);\n    }\n\n    for (int n_culldistance_entry = 0;\n             n_culldistance_entry < N_GL_CULLDISTANCE_ENTRIES;\n           ++n_culldistance_entry)\n    {\n        gl_CullDistance[n_culldistance_entry] = float(n_culldistance_entry) / float(N_GL_CULLDISTANCE_ENTRIES);\n    }\n#else\n    INSERT_STATIC_WRITES\n#endif\n}\n"
                 ,0x301);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_3c8,(string *)local_338);
      if (local_338 != (undefined1  [8])local_328) {
        operator_delete((void *)local_338,(ulong)((long)&(local_328[0].m_log)->flags + 1));
      }
      while (uVar8 = std::__cxx11::string::find((char *)&local_3c8,0x1a32ef2,0),
            uVar8 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)&local_3c8,uVar8,(char *)0x19,(ulong)local_388);
        std::__cxx11::string::_M_assign((string *)&local_3c8);
      }
      while (uVar8 = std::__cxx11::string::find((char *)&local_3c8,0x1a32f15,0),
            uVar8 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)&local_3c8,uVar8,(char *)0x19,(ulong)local_3a8);
        std::__cxx11::string::_M_assign((string *)&local_3c8);
      }
      while (uVar8 = std::__cxx11::string::find((char *)&local_3c8,0x1a33555,0),
            uVar8 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)&local_3c8,uVar8,(char *)0x14,(ulong)local_368);
        std::__cxx11::string::_M_assign((string *)&local_3c8);
      }
      local_3e8 = 0;
      local_348 = local_3c8;
      (**(code **)(lVar6 + 0x12b8))(pNVar12->m_vs_id,1,&local_348,0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glShaderSource() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0xc64);
      (**(code **)(lVar6 + 0x248))(pNVar12->m_vs_id);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0xc67);
      (**(code **)(lVar6 + 0xa70))(pNVar12->m_vs_id,0x8b81,&local_3e8);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      pcVar11 = "glGetShaderiv() call failed.";
      glu::checkError(dVar5,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0xc6a);
      if (local_3e8 == 0) {
        local_424 = 0;
        local_338 = (undefined1  [8])
                    ((pNVar12->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
        getTestDescription_abi_cxx11_
                  (&local_410,(NegativeTest *)pcVar11,(int)local_418,bVar2,
                   use_dynamic_index_based_writes);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_330,local_410._M_dataplus._M_p,local_410._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_330,
                   "has failed (as expected) to compile with the following info log:\n\n",0x42);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
        std::ios_base::~ios_base(local_2c0);
        (**(code **)(lVar6 + 0xa70))(pNVar12->m_vs_id,0x8b84,&local_424);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glGetShaderiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xc78);
        iVar1 = local_424;
        iVar3 = local_424 + 1;
        pGVar9 = (GLchar *)operator_new__((long)iVar3);
        pNVar12 = local_420;
        local_420->m_temp_buffer = pGVar9;
        memset(pGVar9,0,(long)iVar3);
        lVar6 = local_3d8;
        (**(code **)(local_3d8 + 0xa58))(pNVar12->m_vs_id,iVar1,0,pGVar9);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glGetShaderInfoLog() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xc80);
        pNVar12 = local_420;
        local_338 = (undefined1  [8])
                    ((local_420->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
        pcVar11 = pNVar12->m_temp_buffer;
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)local_330 + (int)*(_func_int **)((long)local_330 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,pcVar11,sVar7);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_424 = 0;
        (**(code **)(lVar6 + 0xce8))(pNVar12->m_po_id);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glLinkProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xc8f);
        (**(code **)(lVar6 + 0x9d8))(pNVar12->m_po_id,0x8b82,&local_424);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        pcVar11 = "glGetProgramiv() call failed.";
        glu::checkError(dVar5,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xc92);
        if (local_424 == 1) {
          local_338 = (undefined1  [8])
                      ((pNVar12->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
          getTestDescription_abi_cxx11_
                    (&local_410,(NegativeTest *)pcVar11,(int)local_418,bVar2,
                     use_dynamic_index_based_writes);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_330,local_410._M_dataplus._M_p,local_410._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_330,"has linked successfully which is invalid!",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
          std::ios_base::~ios_base(local_2c0);
          pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar10,
                     "Program object has linked successfully, even though the process should have failed."
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                     ,0xc9b);
          __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        local_3ec = 0;
        local_338 = (undefined1  [8])
                    ((pNVar12->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
        getTestDescription_abi_cxx11_
                  (&local_410,(NegativeTest *)pcVar11,(int)local_418,bVar2,
                   use_dynamic_index_based_writes);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_330,local_410._M_dataplus._M_p,local_410._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_330,
                   "has failed (as expected) to link with the following info log:\n\n",0x3f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
        std::ios_base::~ios_base(local_2c0);
        (**(code **)(lVar6 + 0x9d8))(pNVar12->m_po_id,0x8b84,&local_3ec);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xca8);
        iVar1 = local_3ec;
        iVar3 = local_3ec + 1;
        pGVar9 = (GLchar *)operator_new__((long)iVar3);
        pNVar12 = local_420;
        local_420->m_temp_buffer = pGVar9;
        memset(pGVar9,0,(long)iVar3);
        lVar6 = local_3d8;
        (**(code **)(local_3d8 + 0x988))(pNVar12->m_po_id,iVar1,0,pGVar9);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glGetProgramInfoLog() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xcb0);
        pNVar12 = local_420;
        local_338 = (undefined1  [8])
                    ((local_420->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
        pcVar11 = pNVar12->m_temp_buffer;
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)local_330 + (int)*(_func_int **)((long)local_330 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,pcVar11,sVar7);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
      std::ios_base::~ios_base(local_2c0);
      pNVar12 = local_420;
      if (local_420->m_temp_buffer != (GLchar *)0x0) {
        operator_delete__(local_420->m_temp_buffer);
      }
      pNVar12->m_temp_buffer = (GLchar *)0x0;
      if (local_3c8 != &local_3b8) {
        operator_delete(local_3c8,CONCAT71(uStack_3b7,local_3b8) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      local_418 = local_418 + 1;
    } while (local_418 != 3);
    tcu::TestContext::setTestResult
              ((pNVar12->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS
               ,"Pass");
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,CONCAT71(uStack_357,local_358) + 1);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,CONCAT71(uStack_397,local_398) + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,CONCAT71(uStack_377,local_378) + 1);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CullDistance::NegativeTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Build the test shaders. */
	const glw::GLchar* token_dynamic_index_based_writes = "DYNAMIC_INDEX_BASED_WRITES";
	const glw::GLchar* token_insert_static_writes		= "INSERT_STATIC_WRITES";
	const glw::GLchar* token_n_gl_clipdistance_entries  = "N_GL_CLIPDISTANCE_ENTRIES";
	const glw::GLchar* token_n_gl_culldistance_entries  = "N_GL_CULLDISTANCE_ENTRIES";
	const glw::GLchar* token_redeclare_output_variables = "REDECLARE_OUTPUT_VARIABLES";

	const glw::GLchar* fs_body = "#version 130\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "}\n";

	const glw::GLchar* vs_body_preamble = "#version 130\n"
										  "\n"
										  "    #extension GL_ARB_cull_distance : require\n"
										  "\n";

	const glw::GLchar* vs_body_main = "#ifdef REDECLARE_OUTPUT_VARIABLES\n"
									  "    out float gl_ClipDistance[N_GL_CLIPDISTANCE_ENTRIES];\n"
									  "    out float gl_CullDistance[N_GL_CULLDISTANCE_ENTRIES];\n"
									  "#endif\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "#ifdef DYNAMIC_INDEX_BASED_WRITES\n"
									  "    for (int n_clipdistance_entry = 0;\n"
									  "             n_clipdistance_entry < N_GL_CLIPDISTANCE_ENTRIES;\n"
									  "           ++n_clipdistance_entry)\n"
									  "    {\n"
									  "        gl_ClipDistance[n_clipdistance_entry] = float(n_clipdistance_entry) / "
									  "float(N_GL_CLIPDISTANCE_ENTRIES);\n"
									  "    }\n"
									  "\n"
									  "    for (int n_culldistance_entry = 0;\n"
									  "             n_culldistance_entry < N_GL_CULLDISTANCE_ENTRIES;\n"
									  "           ++n_culldistance_entry)\n"
									  "    {\n"
									  "        gl_CullDistance[n_culldistance_entry] = float(n_culldistance_entry) / "
									  "float(N_GL_CULLDISTANCE_ENTRIES);\n"
									  "    }\n"
									  "#else\n"
									  "    INSERT_STATIC_WRITES\n"
									  "#endif\n"
									  "}\n";

	/* This test should only be executed if ARB_cull_distance is supported, or if
	 * we're running a GL4.5 context
	 */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_cull_distance") &&
		!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)))
	{
		throw tcu::NotSupportedError("GL_ARB_cull_distance is not supported");
	}

	/* It only makes sense to run this test if GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES
	 * is lower than a sum of GL_MAX_CLIP_DISTANCES and GL_MAX_CLIP_CULL_DISTANCES.
	 */
	glw::GLint  gl_max_clip_distances_value					  = 0;
	glw::GLint  gl_max_combined_clip_and_cull_distances_value = 0;
	glw::GLint  gl_max_cull_distances_value					  = 0;
	glw::GLuint n_gl_clipdistance_array_items				  = 0;
	std::string n_gl_clipdistance_array_items_string;
	glw::GLuint n_gl_culldistance_array_items = 0;
	std::string n_gl_culldistance_array_items_string;
	std::string static_write_shader_body_part;

	gl.getIntegerv(GL_MAX_CLIP_DISTANCES, &gl_max_clip_distances_value);
	gl.getIntegerv(GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES, &gl_max_combined_clip_and_cull_distances_value);
	gl.getIntegerv(GL_MAX_CULL_DISTANCES, &gl_max_cull_distances_value);

	if (gl_max_clip_distances_value + gl_max_cull_distances_value < gl_max_combined_clip_and_cull_distances_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES is larger than or equal to "
							  "the sum of GL_MAX_CLIP_DISTANCES and GL_MAX_CULL_DISTANCES. Skipping."
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}

	n_gl_clipdistance_array_items = gl_max_clip_distances_value;
	n_gl_culldistance_array_items = gl_max_combined_clip_and_cull_distances_value - gl_max_clip_distances_value + 1;

	/* Determine the number of items we will want the gl_ClipDistance and gl_CullDistance arrays
	 * to hold for test iterations that will re-declare the built-in output variables.
	 */
	{
		std::stringstream temp_sstream;

		temp_sstream << n_gl_clipdistance_array_items;

		n_gl_clipdistance_array_items_string = temp_sstream.str();
	}

	{
		std::stringstream temp_sstream;

		temp_sstream << n_gl_culldistance_array_items;

		n_gl_culldistance_array_items_string = temp_sstream.str();
	}

	/* Form the "static write" shader body part. */
	{
		std::stringstream temp_sstream;

		temp_sstream << "gl_ClipDistance[" << n_gl_clipdistance_array_items_string.c_str() << "] = 0.0f;\n"
					 << "gl_CullDistance[" << n_gl_culldistance_array_items_string.c_str() << "] = 0.0f;\n";

		static_write_shader_body_part = temp_sstream.str();
	}

	/* Prepare GL objects before we continue */
	glw::GLint compile_status = GL_FALSE;

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_po_id = gl.createProgram();
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() / glCreateShader() calls failed.");

	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_vs_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	gl.shaderSource(m_fs_id, 1,			/* count */
					&fs_body, DE_NULL); /* length */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	gl.compileShader(m_fs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_fs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status == GL_FALSE)
	{
		TCU_FAIL("Fragment shader failed to compile.");
	}

	/* Run three separate test iterations. */
	struct _test_item
	{
		bool should_redeclare_output_variables;
		bool use_dynamic_index_based_writes;
	} test_items[] = { /* Negative Test 1 */
					   { true, false },

					   /* Negative Test 2 */
					   { false, false },

					   /* Negative Test 3 */
					   { false, true }
	};
	const unsigned int n_test_items = sizeof(test_items) / sizeof(test_items[0]);

	for (unsigned int n_test_item = 0; n_test_item < n_test_items; ++n_test_item)
	{
		const _test_item& current_test_item = test_items[n_test_item];

		/* Prepare vertex shader body */
		std::size_t		  token_position = std::string::npos;
		std::stringstream vs_body_sstream;
		std::string		  vs_body_string;

		vs_body_sstream << vs_body_preamble << "\n";

		if (current_test_item.should_redeclare_output_variables)
		{
			vs_body_sstream << "#define " << token_redeclare_output_variables << "\n";
		}

		if (current_test_item.use_dynamic_index_based_writes)
		{
			vs_body_sstream << "#define " << token_dynamic_index_based_writes << "\n";
		}

		vs_body_sstream << vs_body_main;

		/* Replace tokens with meaningful values */
		vs_body_string = vs_body_sstream.str();

		while ((token_position = vs_body_string.find(token_n_gl_clipdistance_entries)) != std::string::npos)
		{
			vs_body_string = vs_body_string.replace(token_position, strlen(token_n_gl_clipdistance_entries),
													n_gl_clipdistance_array_items_string);
		}

		while ((token_position = vs_body_string.find(token_n_gl_culldistance_entries)) != std::string::npos)
		{
			vs_body_string = vs_body_string.replace(token_position, strlen(token_n_gl_clipdistance_entries),
													n_gl_culldistance_array_items_string);
		}

		while ((token_position = vs_body_string.find(token_insert_static_writes)) != std::string::npos)
		{
			vs_body_string = vs_body_string.replace(token_position, strlen(token_insert_static_writes),
													static_write_shader_body_part);
		}

		/* Try to compile the vertex shader */
		glw::GLint  compile_status_internal = GL_FALSE;
		const char* vs_body_raw_ptr			= vs_body_string.c_str();

		gl.shaderSource(m_vs_id, 1,					/* count */
						&vs_body_raw_ptr, DE_NULL); /* length */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

		gl.compileShader(m_vs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &compile_status_internal);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status_internal == GL_FALSE)
		{
			glw::GLint buffer_size = 0;

			/* Log the compilation error */
			m_testCtx.getLog() << tcu::TestLog::Message
							   << getTestDescription(n_test_item, current_test_item.should_redeclare_output_variables,
													 current_test_item.use_dynamic_index_based_writes)
							   << "has failed (as expected) to compile with the following info log:\n\n"
							   << tcu::TestLog::EndMessage;

			gl.getShaderiv(m_vs_id, GL_INFO_LOG_LENGTH, &buffer_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

			m_temp_buffer = new glw::GLchar[buffer_size + 1];

			memset(m_temp_buffer, 0, buffer_size + 1);

			gl.getShaderInfoLog(m_vs_id, buffer_size, DE_NULL, /* length */
								m_temp_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog() call failed.");

			m_testCtx.getLog() << tcu::TestLog::Message << m_temp_buffer << tcu::TestLog::EndMessage;

			delete[] m_temp_buffer;
			m_temp_buffer = DE_NULL;

			/* Move on to the next iteration */
			continue;
		}

		/* Try to link the program object */
		glw::GLint link_status = GL_FALSE;

		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

		if (link_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << getTestDescription(n_test_item, current_test_item.should_redeclare_output_variables,
													 current_test_item.use_dynamic_index_based_writes)
							   << "has linked successfully which is invalid!" << tcu::TestLog::EndMessage;

			TCU_FAIL("Program object has linked successfully, even though the process should have failed.");
		}
		else
		{
			glw::GLint buffer_size = 0;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << getTestDescription(n_test_item, current_test_item.should_redeclare_output_variables,
													 current_test_item.use_dynamic_index_based_writes)
							   << "has failed (as expected) to link with the following info log:\n\n"
							   << tcu::TestLog::EndMessage;

			gl.getProgramiv(m_po_id, GL_INFO_LOG_LENGTH, &buffer_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

			m_temp_buffer = new glw::GLchar[buffer_size + 1];

			memset(m_temp_buffer, 0, buffer_size + 1);

			gl.getProgramInfoLog(m_po_id, buffer_size, DE_NULL, /* length */
								 m_temp_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog() call failed.");

			m_testCtx.getLog() << tcu::TestLog::Message << m_temp_buffer << tcu::TestLog::EndMessage;

			delete[] m_temp_buffer;
			m_temp_buffer = DE_NULL;
		}
	} /* for (all test items) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}